

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader *input,Builder output)

{
  undefined8 *puVar1;
  Reader *this_00;
  Type type;
  long local_c0;
  Reader local_b8;
  Reader local_70;
  
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
  ::find<0ul,capnp::StructSchema::Field&>
            ((Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
              *)&local_c0,(Field *)&((this->impl).ptr)->fieldHandlers);
  if (local_c0 == 0) {
    this_00 = &local_b8;
    DynamicValue::Reader::Reader(this_00,input);
    type = StructSchema::Field::getType(&field);
    encode(this,this_00,type,output);
  }
  else {
    puVar1 = *(undefined8 **)(local_c0 + 0x40);
    this_00 = &local_70;
    DynamicValue::Reader::Reader(this_00,input);
    (**(code **)*puVar1)(puVar1,this,this_00);
  }
  DynamicValue::Reader::~Reader(this_00);
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_SOME(handler, impl->fieldHandlers.find(field)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}